

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O2

PyObject * __thiscall
boost::python::detail::caller_arity<3U>::
impl<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,__object_*,_HighFreqDataType,_int>_>
::operator()(impl<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,__object_*,_HighFreqDataType,_int>_>
             *this,PyObject *args_,PyObject *param_2)

{
  PyObject *pPVar1;
  c_t0 c0;
  c_t2 c2;
  c_t1 c1;
  PyTypeObject *local_f8;
  undefined4 local_ec;
  arg_rvalue_from_python<int> local_e8;
  arg_rvalue_from_python<HighFreqDataType> local_c8;
  
  local_f8 = args_[1].ob_type;
  converter::arg_rvalue_from_python<HighFreqDataType>::arg_rvalue_from_python
            (&local_c8,(PyObject *)args_[2].ob_refcnt);
  if ((undefined1 *)
      local_c8.m_data.super_rvalue_from_python_storage<HighFreqDataType_&>.stage1.convertible ==
      (undefined1 *)0x0) {
    pPVar1 = (PyObject *)0x0;
  }
  else {
    converter::arg_rvalue_from_python<int>::arg_rvalue_from_python
              (&local_e8,(PyObject *)args_[2].ob_type);
    if (local_e8.m_data.super_rvalue_from_python_storage<int_&>.stage1.convertible == (void *)0x0) {
      pPVar1 = (PyObject *)0x0;
    }
    else {
      local_ec = 0;
      pPVar1 = invoke<int,void(*)(_object*,HighFreqDataType,int),boost::python::arg_from_python<_object*>,boost::python::arg_from_python<HighFreqDataType>,boost::python::arg_from_python<int>>
                         (&local_ec,this,&local_f8,&local_c8,&local_e8);
    }
    if ((type *)local_c8.m_data.super_rvalue_from_python_storage<HighFreqDataType_&>.stage1.
                convertible ==
        &local_c8.m_data.super_rvalue_from_python_storage<HighFreqDataType_&>.storage) {
      (**local_c8.m_data.super_rvalue_from_python_storage<HighFreqDataType_&>.storage.t7)();
    }
  }
  return pPVar1;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }